

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double deranged_mean(int a)

{
  double dVar1;
  undefined4 local_24;
  int x;
  double pdf;
  double mean;
  int a_local;
  
  pdf = 0.0;
  for (local_24 = 0; local_24 <= a; local_24 = local_24 + 1) {
    dVar1 = deranged_pdf(local_24,a);
    pdf = dVar1 * (double)local_24 + pdf;
  }
  return pdf;
}

Assistant:

double deranged_mean ( int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_MEAN returns the mean of the Deranged CDF.
//
//  Discussion:
//
//    The mean is computed by straightforward summation.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of items.
//    1 <= A.
//
//    Output, double MEAN, the mean of the PDF.
//
{
  double mean;
  double pdf;
  int x;

  mean = 0.0;
  for ( x = 0; x <= a; x++ )
  {
    pdf = deranged_pdf ( x, a );
    mean = mean + pdf * x;
  }

  return mean;
}